

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
asl::Array<asl::Map<asl::String,_int>::KeyVal>::free
          (Array<asl::Map<asl::String,_int>::KeyVal> *this,void *__ptr)

{
  KeyVal *pKVar1;
  long lVar2;
  long lVar3;
  
  pKVar1 = this->_a;
  lVar3 = (long)*(int *)((long)&pKVar1[-1].key.field_2 + 8);
  if (lVar3 != 0) {
    lVar2 = 0;
    do {
      if (*(int *)((long)&(pKVar1->key)._size + lVar2) != 0) {
        ::free(*(void **)((long)&(pKVar1->key).field_2 + lVar2));
      }
      lVar2 = lVar2 + 0x20;
    } while (lVar3 * 0x20 != lVar2);
  }
  ::free((void *)((long)&this->_a[-1].key.field_2 + 8));
  this->_a = (KeyVal *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}